

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O3

bool __thiscall ON_ParseSettings::IsUnaryMinus(ON_ParseSettings *this,ON__UINT32 c)

{
  byte bVar1;
  
  if ((int)c < 0x2796) {
    if (c == 0x2d) {
      bVar1 = (byte)this->m_true_default_bits[1] & 0x80;
    }
    else {
      if (c != 0x2d7) {
        return false;
      }
      bVar1 = *(byte *)((long)this->m_true_default_bits + 5) & 1;
    }
  }
  else if (c == 0x2796) {
    bVar1 = *(byte *)((long)this->m_true_default_bits + 5) & 2;
  }
  else {
    if (c != 0xfe63) {
      if (c != 0xff0d) {
        return false;
      }
      if ((*(byte *)((long)this->m_true_default_bits + 5) & 8) == 0) {
        return true;
      }
      return false;
    }
    bVar1 = *(byte *)((long)this->m_true_default_bits + 5) & 4;
  }
  if (bVar1 != 0) {
    return false;
  }
  return true;
}

Assistant:

bool ON_ParseSettings::IsUnaryMinus(ON__UINT32 c) const
{
  switch(c)
  {
  case 0x002D: // hyphen-minus
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_hyphen_minus_as_unary_minus) )
      return true;
    break;

  case 0x02D7: // modifier letter minus sign
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_modifier_letter_minus_sign_as_unary_minus) )
      return true;
    break;

  case 0x2796: // heavy minus sign
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_heavy_minus_sign_as_unary_minus) )
      return true;
    break;

  case 0xFE63: // small hyphen-minus
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_small_hyphen_minus_as_unary_minus) )
      return true;
    break;

  case 0xFF0D: // fullwidth hyphen-minus
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_fullwidth_hyphen_minus_as_unary_minus) )
      return true;
    break;
  }
  return false;
}